

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O0

void __thiscall btSliderConstraint::testLinLimits(btSliderConstraint *this)

{
  float fVar1;
  btScalar *pbVar2;
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x140) = 0;
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
  *(btScalar *)(in_RDI + 0x450) = *pbVar2;
  if (*(float *)(in_RDI + 0xd4) < *(float *)(in_RDI + 0xd0)) {
    pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
    *pbVar2 = 0.0;
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
    if (*pbVar2 < *(float *)(in_RDI + 0xd4) || *pbVar2 == *(float *)(in_RDI + 0xd4)) {
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
      if (*(float *)(in_RDI + 0xd0) <= *pbVar2) {
        pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
        *pbVar2 = 0.0;
      }
      else {
        fVar1 = *(float *)(in_RDI + 0xd0);
        pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
        *pbVar2 = *pbVar2 - fVar1;
        *(undefined1 *)(in_RDI + 0x140) = 1;
      }
    }
    else {
      fVar1 = *(float *)(in_RDI + 0xd4);
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x420));
      *pbVar2 = *pbVar2 - fVar1;
      *(undefined1 *)(in_RDI + 0x140) = 1;
    }
  }
  return;
}

Assistant:

void btSliderConstraint::testLinLimits(void)
{
	m_solveLinLim = false;
	m_linPos = m_depth[0];
	if(m_lowerLinLimit <= m_upperLinLimit)
	{
		if(m_depth[0] > m_upperLinLimit)
		{
			m_depth[0] -= m_upperLinLimit;
			m_solveLinLim = true;
		}
		else if(m_depth[0] < m_lowerLinLimit)
		{
			m_depth[0] -= m_lowerLinLimit;
			m_solveLinLim = true;
		}
		else
		{
			m_depth[0] = btScalar(0.);
		}
	}
	else
	{
		m_depth[0] = btScalar(0.);
	}
}